

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O0

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::collect_changes
          (DynamicPartialIndex *this,vertex_t s,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *reverse_graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  uint uVar1;
  size_type sVar2;
  value_type vVar3;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  const_reference this_00;
  reference __x;
  uint *nxt;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  value_type cur;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dist_local;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *reverse_graph_local;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *graph_local;
  DynamicPartialIndex *pDStack_10;
  vertex_t s_local;
  DynamicPartialIndex *this_local;
  
  this->back_ = 0;
  this->front_ = 0;
  graph_local._4_4_ = s;
  pDStack_10 = this;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)s);
  if ((*pvVar5 != '\0') &&
     (bVar4 = has_parent(this,graph_local._4_4_,reverse_graph,dist), vVar3 = graph_local._4_4_,
     !bVar4)) {
    sVar2 = this->back_;
    this->back_ = sVar2 + 1;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar2);
    *pvVar6 = vVar3;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (dist,(ulong)graph_local._4_4_);
    *pvVar5 = '?';
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (this->updated_,(value_type *)((long)&graph_local + 4));
  }
  while (this->back_ != this->front_) {
    sVar2 = this->front_;
    this->front_ = sVar2 + 1;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar2);
    this_00 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::at(graph,(ulong)*pvVar6);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
    nxt = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)&nxt), bVar4) {
      __x = __gnu_cxx::
            __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator*(&__end2);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*__x);
      if (((*pvVar5 != '?') &&
          (pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*__x)
          , *pvVar5 != '\0')) && (bVar4 = has_parent(this,*__x,reverse_graph,dist), !bVar4)) {
        uVar1 = *__x;
        sVar2 = this->back_;
        this->back_ = sVar2 + 1;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar2);
        *pvVar6 = uVar1;
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*__x);
        *pvVar5 = '?';
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this->updated_,__x);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void
DynamicScalableKReach::DynamicPartialIndex::collect_changes(vertex_t s, const std::vector<std::vector<vertex_t>> &graph,
                                                            const std::vector<std::vector<vertex_t>> &reverse_graph,
                                                            std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    if (dist.at(s) > 0 && !has_parent(s, reverse_graph, dist)) {
        queue_.at(back_++) = s;
        dist.at(s) = INF8;
        updated_.push_back(s);
    }
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        for (const auto &nxt : graph.at(cur)) {
            if (dist.at(nxt) != INF8 && dist.at(nxt) > 0 && !has_parent(nxt, reverse_graph, dist)) {
                queue_.at(back_++) = nxt;
                dist.at(nxt) = INF8;
                updated_.push_back(nxt);
            }
        }
    }
}